

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

optional_idx __thiscall
duckdb::FunctionBinder::BindFunctionCost
          (FunctionBinder *this,SimpleFunction *func,vector<duckdb::LogicalType,_true> *arguments)

{
  const_reference pvVar1;
  CastFunctionSet *this_00;
  const_reference target;
  int64_t iVar2;
  ulong uVar3;
  size_type __n;
  bool bVar4;
  bool bVar5;
  optional_idx local_50;
  idx_t local_48;
  ulong local_40;
  vector<duckdb::LogicalType,_true> *local_38;
  
  if ((func->varargs).id_ == INVALID) {
    if ((long)(func->arguments).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(func->arguments).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
      bVar5 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
      bVar4 = !bVar5;
      if (bVar5) {
        local_48 = 0;
        uVar3 = 0;
      }
      else {
        local_38 = &func->arguments;
        local_48 = 0;
        __n = 0;
        local_40 = 0;
        do {
          pvVar1 = vector<duckdb::LogicalType,_true>::operator[](arguments,__n);
          if (pvVar1->id_ == UNKNOWN) {
            local_40 = CONCAT71((int7)((ulong)pvVar1 >> 8),1);
          }
          else {
            this_00 = CastFunctionSet::Get(this->context);
            pvVar1 = vector<duckdb::LogicalType,_true>::operator[](arguments,__n);
            target = vector<duckdb::LogicalType,_true>::operator[](local_38,__n);
            iVar2 = CastFunctionSet::ImplicitCastCost(this_00,pvVar1,target);
            if (iVar2 < 0) {
              local_50.index = 0xffffffffffffffff;
              uVar3 = local_40;
              break;
            }
            local_48 = local_48 + iVar2;
          }
          __n = __n + 1;
          bVar4 = __n < (ulong)(((long)(arguments->
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ).
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(arguments->
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ).
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555);
          uVar3 = local_40;
        } while (bVar4);
      }
      if (!bVar4) {
        if ((uVar3 & 1) == 0) {
          optional_idx::optional_idx(&local_50,local_48);
        }
        else {
          local_50.index = 0;
        }
      }
    }
    else {
      local_50.index = 0xffffffffffffffff;
    }
  }
  else {
    local_50 = BindVarArgsFunctionCost(this,func,arguments);
  }
  return (optional_idx)local_50.index;
}

Assistant:

optional_idx FunctionBinder::BindFunctionCost(const SimpleFunction &func, const vector<LogicalType> &arguments) {
	if (func.HasVarArgs()) {
		// special case varargs function
		return BindVarArgsFunctionCost(func, arguments);
	}
	if (func.arguments.size() != arguments.size()) {
		// invalid argument count: check the next function
		return optional_idx();
	}
	idx_t cost = 0;
	bool has_parameter = false;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i].id() == LogicalTypeId::UNKNOWN) {
			has_parameter = true;
			continue;
		}
		int64_t cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(arguments[i], func.arguments[i]);
		if (cast_cost >= 0) {
			// we can implicitly cast, add the cost to the total cost
			cost += idx_t(cast_cost);
		} else {
			// we can't implicitly cast: throw an error
			return optional_idx();
		}
	}
	if (has_parameter) {
		// all arguments are implicitly castable and there is a parameter - return 0 as cost
		return 0;
	}
	return cost;
}